

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismExtend.cpp
# Opt level: O2

int pztopology::Pr<pztopology::TPZPoint>::SideNodeLocId(int side,int node)

{
  ostream *poVar1;
  int iVar2;
  
  iVar2 = side;
  if ((1 < (uint)side) && (iVar2 = node, 1 < (uint)node)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Pr<TFather>::SideNodeLocId inconsistent side or node ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,side);
    poVar1 = std::operator<<(poVar1,' ');
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,node);
    std::endl<char,std::char_traits<char>>(poVar1);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int Pr<TFather>::SideNodeLocId(int side, int node)
	{
		int ftns = side/TFather::NSides;
		int fatherside = side%TFather::NSides;
		if(ftns == 0) return TFather::SideNodeLocId(side,node);
		if(ftns == 1) return TFather::SideNodeLocId(side-TFather::NSides,node)+TFather::NCornerNodes;
		int fatherlevel = node/TFather::NSideNodes(fatherside);
		if(fatherlevel == 0) return TFather::SideNodeLocId(fatherside,node);
		if(fatherlevel == 1) return TFather::SideNodeLocId(fatherside,node-TFather::NSideNodes(fatherside))+TFather::NCornerNodes;//TFather::NSideNodes(fatherside);
		PZError << "Pr<TFather>::SideNodeLocId inconsistent side or node " << side
		<< ' ' << node << endl;
		return -1;
	}